

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O3

int __thiscall
chrono::ChSystemDescriptor::FromUnknownsToVector
          (ChSystemDescriptor *this,ChVectorDynamic<> *mvector,bool resize_vector)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  uint uVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  ChVariables *pCVar7;
  double *pdVar8;
  ChConstraint *pCVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  int iVar16;
  uint uVar17;
  Index size;
  ulong uVar18;
  undefined7 in_register_00000011;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  undefined1 auVar26 [16];
  ChVectorRef local_48;
  
  iVar16 = (*this->_vptr_ChSystemDescriptor[7])();
  this->n_q = iVar16;
  iVar16 = (*this->_vptr_ChSystemDescriptor[8])(this);
  this->n_c = iVar16;
  if ((int)CONCAT71(in_register_00000011,resize_vector) != 0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)iVar16 + (long)this->n_q);
    lVar25 = (mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if (lVar25 < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if (lVar25 != 0) {
      memset((mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar25 << 3);
    }
  }
  ppCVar5 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar6 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar25 = ((long)(this->vvariables).
                  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_start) * 0x20000000;
  if (lVar25 != 0) {
    lVar25 = lVar25 >> 0x20;
    lVar20 = 0;
    do {
      pCVar7 = (this->vvariables).
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar20];
      if (pCVar7->disabled == false) {
        ChVariables::Get_qb(&local_48,pCVar7);
        pCVar7 = (this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar20];
        uVar4 = pCVar7->offset;
        uVar17 = (*pCVar7->_vptr_ChVariables[2])();
        pdVar8 = (mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data;
        if ((int)uVar17 < 0 && pdVar8 != (double *)0x0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                       );
        }
        uVar18 = (ulong)(int)uVar17;
        if (((int)(uVar17 | uVar4) < 0) ||
           ((long)((mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_rows - uVar18) < (long)(int)uVar4)) {
          __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                        "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                       );
        }
        if (local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._8_8_ != uVar18) {
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                        "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
                       );
        }
        pdVar8 = pdVar8 + (int)uVar4;
        uVar19 = uVar18;
        if ((((ulong)pdVar8 & 7) == 0) &&
           (uVar19 = (ulong)(-((uint)((ulong)pdVar8 >> 3) & 0x1fffffff) & 7),
           (long)uVar18 <= (long)uVar19)) {
          uVar19 = uVar18;
        }
        uVar22 = uVar18 - uVar19;
        uVar21 = uVar22 + 7;
        if (-1 < (long)uVar22) {
          uVar21 = uVar22;
        }
        if (0 < (long)uVar19) {
          uVar24 = 0;
          do {
            pdVar8[uVar24] =
                 *(double *)
                  (local_48.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_ + uVar24 * 8);
            uVar24 = uVar24 + 1;
          } while (uVar19 != uVar24);
        }
        uVar21 = (uVar21 & 0xfffffffffffffff8) + uVar19;
        if (7 < (long)uVar22) {
          do {
            pdVar1 = (double *)
                     (local_48.
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                      ._0_8_ + uVar19 * 8);
            dVar3 = pdVar1[1];
            dVar10 = pdVar1[2];
            dVar11 = pdVar1[3];
            dVar12 = pdVar1[4];
            dVar13 = pdVar1[5];
            dVar14 = pdVar1[6];
            dVar15 = pdVar1[7];
            pdVar2 = pdVar8 + uVar19;
            *pdVar2 = *pdVar1;
            pdVar2[1] = dVar3;
            pdVar2[2] = dVar10;
            pdVar2[3] = dVar11;
            pdVar2[4] = dVar12;
            pdVar2[5] = dVar13;
            pdVar2[6] = dVar14;
            pdVar2[7] = dVar15;
            uVar19 = uVar19 + 8;
          } while ((long)uVar19 < (long)uVar21);
        }
        if ((long)uVar21 < (long)uVar18) {
          do {
            pdVar8[uVar21] =
                 *(double *)
                  (local_48.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_ + uVar21 * 8);
            uVar21 = uVar21 + 1;
          } while (uVar18 != uVar21);
        }
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != lVar25 + (ulong)(lVar25 == 0));
  }
  iVar16 = this->n_q;
  lVar25 = ((long)ppCVar5 - (long)ppCVar6) * 0x20000000;
  if (lVar25 != 0) {
    ppCVar5 = (this->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar8 = (mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    lVar25 = lVar25 >> 0x20;
    lVar20 = 0;
    do {
      pCVar9 = ppCVar5[lVar20];
      if (pCVar9->active == true) {
        lVar23 = (long)pCVar9->offset + (long)iVar16;
        if (((int)lVar23 < 0) ||
           ((mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows <= lVar23)) {
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        auVar26._0_8_ = -pCVar9->l_i;
        auVar26._8_4_ = 0;
        auVar26._12_4_ = 0x80000000;
        dVar3 = (double)vmovlps_avx(auVar26);
        pdVar8[lVar23] = dVar3;
      }
      lVar20 = lVar20 + 1;
    } while (lVar25 + (ulong)(lVar25 == 0) != lVar20);
  }
  return iVar16 + this->n_c;
}

Assistant:

int ChSystemDescriptor::FromUnknownsToVector(ChVectorDynamic<>& mvector, bool resize_vector) {
    // Count active variables & constraints and resize vector if necessary
    n_q = CountActiveVariables();
    n_c = CountActiveConstraints();

    if (resize_vector) {
        mvector.setZero(n_q + n_c);
    }

    auto vv_size = (int)vvariables.size();
    auto vc_size = (int)vconstraints.size();

    // Fill the first part of vector, x.q ,with variables q
    for (size_t iv = 0; iv < vv_size; iv++) {
        if (vvariables[iv]->IsActive()) {
            mvector.segment(vvariables[iv]->GetOffset(), vvariables[iv]->Get_ndof()) = vvariables[iv]->Get_qb();
        }
    }

    // Fill the second part of vector, x.l, with constraint multipliers -l (with flipped sign!)
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            mvector(vconstraints[ic]->GetOffset() + n_q) = -vconstraints[ic]->Get_l_i();
        }
    }

    return n_q + n_c;
}